

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-types.hh
# Opt level: O0

void __thiscall tinyusdz::TypedTimeSamples<double>::update(TypedTimeSamples<double> *this)

{
  iterator iVar1;
  iterator iVar2;
  TypedTimeSamples<double> *this_local;
  
  iVar1 = ::std::
          vector<tinyusdz::TypedTimeSamples<double>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<double>::Sample>_>
          ::begin(&this->_samples);
  iVar2 = ::std::
          vector<tinyusdz::TypedTimeSamples<double>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<double>::Sample>_>
          ::end(&this->_samples);
  ::std::
  sort<__gnu_cxx::__normal_iterator<tinyusdz::TypedTimeSamples<double>::Sample*,std::vector<tinyusdz::TypedTimeSamples<double>::Sample,std::allocator<tinyusdz::TypedTimeSamples<double>::Sample>>>,tinyusdz::TypedTimeSamples<double>::update()const::_lambda(tinyusdz::TypedTimeSamples<double>::Sample_const&,tinyusdz::TypedTimeSamples<double>::Sample_const&)_1_>
            (iVar1._M_current,iVar2._M_current);
  this->_dirty = false;
  return;
}

Assistant:

void update() const {
    std::sort(_samples.begin(), _samples.end(),
              [](const Sample &a, const Sample &b) { return a.t < b.t; });

    _dirty = false;

    return;
  }